

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_buffer.hpp
# Opt level: O2

void __thiscall duckdb::ArrowBuffer::resize(ArrowBuffer *this,idx_t bytes,data_t value)

{
  ulong uVar1;
  
  reserve(this,bytes);
  for (uVar1 = this->count; uVar1 < bytes; uVar1 = uVar1 + 1) {
    this->dataptr[uVar1] = value;
  }
  this->count = bytes;
  return;
}

Assistant:

void resize(idx_t bytes, data_t value) { // NOLINT
		reserve(bytes);
		for (idx_t i = count; i < bytes; i++) {
			dataptr[i] = value;
		}
		count = bytes;
	}